

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManComputeCuts(Mf_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  char *pTitle;
  long lVar3;
  long lVar4;
  
  pGVar2 = p->pGia;
  if (0 < pGVar2->nObjs) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      uVar1 = *(uint *)(&pGVar2->pObjs->field_0x0 + lVar4);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        Mf_ObjMergeOrder(p,(int)lVar3);
        pGVar2 = p->pGia;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < pGVar2->nObjs);
  }
  Mf_ManSetMapRefs(p);
  if (p->fUseEla == 0) {
    pTitle = "Area ";
    if (p->Iter == 0) {
      pTitle = "Delay";
    }
  }
  else {
    pTitle = "Ela  ";
  }
  Mf_ManPrintStats(p,pTitle);
  return;
}

Assistant:

void Mf_ManComputeCuts( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjMergeOrder( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}